

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall
FBaseCVar::FBaseCVar(FBaseCVar *this,char *var_name,DWORD flags,_func_void_FBaseCVar_ptr *callback)

{
  char *pcVar1;
  UCVarValue value_00;
  UCVarValue value;
  FBaseCVar *pFStack_30;
  ECVarType type;
  FBaseCVar *var;
  _func_void_FBaseCVar_ptr *callback_local;
  char *pcStack_18;
  DWORD flags_local;
  char *var_name_local;
  FBaseCVar *this_local;
  undefined4 extraout_var;
  
  this->_vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_00b68e30;
  var = (FBaseCVar *)callback;
  callback_local._4_4_ = flags;
  pcStack_18 = var_name;
  var_name_local = (char *)this;
  pFStack_30 = FindCVar(var_name,(FBaseCVar **)0x0);
  this->m_Callback = (_func_void_FBaseCVar_ptr *)var;
  this->Flags = 0;
  this->Name = (char *)0x0;
  if (pcStack_18 != (char *)0x0) {
    C_AddTabCommand(pcStack_18);
    pcVar1 = copystring(pcStack_18);
    this->Name = pcVar1;
    this->m_Next = CVars;
    CVars = this;
  }
  if (pFStack_30 == (FBaseCVar *)0x0) {
    this->Flags = callback_local._4_4_ | 0x80;
  }
  else {
    value_00._0_4_ = (*pFStack_30->_vptr_FBaseCVar[5])(pFStack_30,(long)&value + 4);
    value_00._4_4_ = extraout_var;
    ForceSet(this,value_00,value._4_4_,false);
    if ((pFStack_30->Flags & 0x100) == 0) {
      (**pFStack_30->_vptr_FBaseCVar)();
    }
    else if (pFStack_30 != (FBaseCVar *)0x0) {
      (*pFStack_30->_vptr_FBaseCVar[1])();
    }
    this->Flags = callback_local._4_4_;
  }
  return;
}

Assistant:

FBaseCVar::FBaseCVar (const char *var_name, DWORD flags, void (*callback)(FBaseCVar &))
{
	FBaseCVar *var;

	var = FindCVar (var_name, NULL);

	m_Callback = callback;
	Flags = 0;
	Name = NULL;

	if (var_name)
	{
		C_AddTabCommand (var_name);
		Name = copystring (var_name);
		m_Next = CVars;
		CVars = this;
	}

	if (var)
	{
		ECVarType type;
		UCVarValue value;

		value = var->GetFavoriteRep (&type);
		ForceSet (value, type);

		if (var->Flags & CVAR_AUTO)
			delete var;
		else
			var->~FBaseCVar();

		Flags = flags;
	}
	else
	{
		Flags = flags | CVAR_ISDEFAULT;
	}
}